

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper_ssl.cpp
# Opt level: O0

string * __thiscall
license::CryptoHelperLinux::signString
          (string *__return_storage_ptr__,CryptoHelperLinux *this,string *license)

{
  int iVar1;
  logic_error *plVar2;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  undefined8 uVar3;
  undefined8 uVar4;
  uchar *sigret;
  EVP_MD_CTX *mdctx;
  uchar *signature;
  size_t slen;
  string *local_20;
  string *license_local;
  CryptoHelperLinux *this_local;
  string *signatureStr;
  
  local_20 = license;
  license_local = (string *)this;
  this_local = (CryptoHelperLinux *)__return_storage_ptr__;
  if (this->m_pktmp == (EVP_PKEY *)0x0) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (plVar2,"private key not initialized. Call generate or load first.");
    __cxa_throw(plVar2,std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx == (EVP_MD_CTX *)0x0) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Message digest creation context");
    __cxa_throw(plVar2,std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  type = EVP_sha256();
  iVar1 = EVP_DigestSignInit(ctx,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,(EVP_PKEY *)this->m_pktmp);
  if (iVar1 != 1) {
    EVP_MD_CTX_free(ctx);
  }
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::length();
  iVar1 = EVP_DigestSignUpdate(ctx,uVar3,uVar4);
  if (iVar1 != 1) {
    EVP_MD_CTX_free(ctx);
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Message signing exception");
    __cxa_throw(plVar2,std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  iVar1 = EVP_DigestSignFinal(ctx,(uchar *)0x0,(size_t *)&signature);
  if (iVar1 != 1) {
    EVP_MD_CTX_free(ctx);
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Message signature finalization exception");
    __cxa_throw(plVar2,std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  sigret = (uchar *)CRYPTO_malloc((int)signature,
                                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/base_lib/openssl/crypto_helper_ssl.cpp"
                                  ,0x7e);
  if (sigret != (uchar *)0x0) {
    iVar1 = EVP_DigestSignFinal(ctx,sigret,(size_t *)&signature);
    if (iVar1 == 1) {
      Opensslb64Encode_abi_cxx11_(__return_storage_ptr__,this,(size_t)signature,sigret);
      if (sigret != (uchar *)0x0) {
        CRYPTO_free(sigret);
      }
      EVP_MD_CTX_free(ctx);
      return __return_storage_ptr__;
    }
    CRYPTO_free(sigret);
    EVP_MD_CTX_free(ctx);
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Message signature exception");
    __cxa_throw(plVar2,std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  EVP_MD_CTX_free(ctx);
  plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar2,"Message signature memory allocation exception");
  __cxa_throw(plVar2,std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const string CryptoHelperLinux::signString(const string &license) const {
	if (!m_pktmp) {
		throw logic_error("private key not initialized. Call generate or load first.");
	}

	size_t slen;
	unsigned char *signature = nullptr;
	/* Create the Message Digest Context */
	EVP_MD_CTX *mdctx = EVP_MD_CTX_create();
	if (!mdctx) {
		throw logic_error("Message digest creation context");
	}

	/*Initialise the DigestSign operation - SHA-256 has been selected
	 * as the message digest function */
	if (1 != EVP_DigestSignInit(mdctx, NULL, EVP_sha256(), NULL, m_pktmp)) {
		EVP_MD_CTX_destroy(mdctx);
	}
	/* Call update with the message */
	if (EVP_DigestSignUpdate(mdctx, (const void *)license.c_str(), (size_t)license.length()) != 1) {
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signing exception");
	}
	/* Finalise the DigestSign operation */
	/* First call EVP_DigestSignFinal with a NULL sig parameter to obtain the length of the
	 * signature. Length is returned in slen */
	if (EVP_DigestSignFinal(mdctx, NULL, &slen) != 1) {
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signature finalization exception");
	}
	/* Allocate memory for the signature based on size in slen */
	if (!(signature = (unsigned char *)OPENSSL_malloc(sizeof(unsigned char) * slen))) {
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signature memory allocation exception");
	}
	/* Obtain the signature */
	if (1 != EVP_DigestSignFinal(mdctx, signature, &slen)) {
		OPENSSL_free(signature);
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signature exception");
	}

	string signatureStr = Opensslb64Encode(slen, signature);

	if (signature) OPENSSL_free(signature);
	EVP_MD_CTX_destroy(mdctx);
	return signatureStr;
}